

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_xmlwriter.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  ulong uVar1;
  ostream *poVar2;
  XmlEncode local_48;
  byte local_1a;
  byte local_19;
  bool tagWasOpen;
  string *psStack_18;
  bool indent_local;
  string *text_local;
  XmlWriter *this_local;
  
  local_19 = indent;
  psStack_18 = text;
  text_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1a = this->m_tagIsOpen & 1;
    ensureTagClosed(this);
    if (((local_1a & 1) != 0) && ((local_19 & 1) != 0)) {
      poVar2 = stream(this);
      std::operator<<(poVar2,(string *)&this->m_indent);
    }
    poVar2 = stream(this);
    XmlEncode::XmlEncode(&local_48,psStack_18,ForTextNodes);
    Catch::operator<<(poVar2,&local_48);
    XmlEncode::~XmlEncode(&local_48);
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& writeText( std::string const& text, bool indent = true ) {
            if( !text.empty() ){
                bool tagWasOpen = m_tagIsOpen;
                ensureTagClosed();
                if( tagWasOpen && indent )
                    stream() << m_indent;
                stream() << XmlEncode( text );
                m_needsNewline = true;
            }
            return *this;
        }